

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

char * BinaryenTryGetCatchTagAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  bool bVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> *this;
  const_pointer pvVar3;
  Expression *expression;
  BinaryenIndex index_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::Try>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe76,
                  "const char *BinaryenTryGetCatchTagAt(BinaryenExpressionRef, BinaryenIndex)");
  }
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                    ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)&expr[2].type);
  if (index < sVar2) {
    this = (basic_string_view<char,_std::char_traits<char>_> *)
           ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                     ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)&expr[2].type,
                      (ulong)index);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(this);
    return pvVar3;
  }
  __assert_fail("index < static_cast<Try*>(expression)->catchTags.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xe77,"const char *BinaryenTryGetCatchTagAt(BinaryenExpressionRef, BinaryenIndex)")
  ;
}

Assistant:

const char* BinaryenTryGetCatchTagAt(BinaryenExpressionRef expr,
                                     BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(index < static_cast<Try*>(expression)->catchTags.size());
  return static_cast<Try*>(expression)->catchTags[index].str.data();
}